

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbeglwindow.cpp
# Opt level: O0

void __thiscall QXcbEglWindow::create(QXcbEglWindow *this)

{
  bool bVar1;
  code *pcVar2;
  EGLDisplay pvVar3;
  undefined8 uVar4;
  long in_RDI;
  PFNEGLCREATEPLATFORMWINDOWSURFACEEXTPROC createPlatformWindowSurface;
  
  QXcbWindow::create();
  bVar1 = QXcbEglIntegration::usingPlatformDisplay(*(QXcbEglIntegration **)(in_RDI + 0x100));
  if (bVar1) {
    pcVar2 = (code *)eglGetProcAddress("eglCreatePlatformWindowSurfaceEXT");
    pvVar3 = QXcbEglIntegration::eglDisplay(*(QXcbEglIntegration **)(in_RDI + 0x100));
    uVar4 = (*pcVar2)(pvVar3,*(undefined8 *)(in_RDI + 0x108),in_RDI + 0x40,0);
    *(undefined8 *)(in_RDI + 0x110) = uVar4;
  }
  else {
    pvVar3 = QXcbEglIntegration::eglDisplay(*(QXcbEglIntegration **)(in_RDI + 0x100));
    uVar4 = eglCreateWindowSurface
                      (pvVar3,*(undefined8 *)(in_RDI + 0x108),*(undefined4 *)(in_RDI + 0x40),0);
    *(undefined8 *)(in_RDI + 0x110) = uVar4;
  }
  return;
}

Assistant:

void QXcbEglWindow::create()
{
    QXcbWindow::create();

    // this is always true without egl_x11
    if (m_glIntegration->usingPlatformDisplay()) {
        auto createPlatformWindowSurface = reinterpret_cast<PFNEGLCREATEPLATFORMWINDOWSURFACEEXTPROC>(
            eglGetProcAddress("eglCreatePlatformWindowSurfaceEXT"));
        m_surface = createPlatformWindowSurface(m_glIntegration->eglDisplay(),
                                                m_config,
                                                reinterpret_cast<void *>(&m_window),
                                                nullptr);
        return;
    }

#if QT_CONFIG(egl_x11)
    m_surface = eglCreateWindowSurface(m_glIntegration->eglDisplay(), m_config, m_window, nullptr);
#endif
}